

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O0

void test_bson_append_utf8(void)

{
  byte bVar1;
  bson_t *a;
  bson_t *b_00;
  bson_t *b2;
  bson_t *b;
  
  a = (bson_t *)bson_new();
  b_00 = get_bson("test11.bson");
  bVar1 = bson_append_utf8(a,"hello",0xffffffff,"world");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
            0xa9,"test_bson_append_utf8","bson_append_utf8 (b, \"hello\", -1, \"world\", -1)");
    abort();
  }
  BSON_ASSERT_BSON_EQUAL(a,b_00);
  bson_destroy(a);
  bson_destroy(b_00);
  return;
}

Assistant:

static void
test_bson_append_utf8 (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   b2 = get_bson ("test11.bson");
   BSON_ASSERT (bson_append_utf8 (b, "hello", -1, "world", -1));
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}